

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareShaderStage
          (VaryingComponentsTest *this,STAGES stage,Type *vector_type,
          ProgramInterface *program_interface,testCase *test_case,
          VaryingPassthrough *varying_passthrough)

{
  VaryingComponentsTest *pVVar1;
  bool bVar2;
  GLuint GVar3;
  GLuint last_in_location;
  GLuint last_out_location;
  ShaderInterface *si;
  Variable *in;
  Variable *out;
  char *pcVar4;
  GLchar **ppGVar5;
  GLchar **ppGVar6;
  descriptor *desc;
  descriptor *desc_00;
  GLint *pGVar7;
  char *this_00;
  GLuint *pGVar8;
  char **ppcVar9;
  char *pcVar10;
  undefined4 uVar11;
  GLchar **ppGVar12;
  GLuint *pGVar13;
  int iVar14;
  ulong uVar15;
  descriptor *in_desc;
  undefined4 *puVar16;
  descriptor desc_in [8];
  char **local_3a0;
  char **local_398;
  GLuint *local_390;
  descriptor local_1f8;
  undefined4 local_1c8 [2];
  char *local_1c0;
  GLuint local_1b8 [2];
  char *local_1b0;
  GLuint local_1a8 [2];
  char *local_1a0;
  undefined4 local_198;
  char *local_190;
  GLint local_188 [2];
  char *local_180;
  GLuint local_178 [2];
  char *local_170;
  undefined4 local_168 [2];
  char *local_160;
  GLuint local_158 [2];
  char *local_150;
  GLuint local_148 [2];
  char *local_140;
  undefined4 local_138;
  char *local_130;
  GLint local_128 [2];
  char *local_120;
  GLuint local_118 [2];
  char *local_110;
  undefined4 local_108 [2];
  char *local_100;
  GLuint local_f8 [2];
  char *local_f0;
  GLuint local_e8 [2];
  char *local_e0;
  undefined4 local_d8;
  GLchar *local_d0;
  GLint local_c8 [2];
  GLchar *local_c0;
  GLuint local_b8 [2];
  GLchar *local_b0;
  undefined4 local_a8 [2];
  char *local_a0;
  GLuint local_98 [2];
  char *local_90;
  GLuint local_88 [2];
  char *local_80 [2];
  bool *local_70;
  VaryingPassthrough *local_68;
  _func_int **local_60;
  undefined4 local_58;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  desc_00 = (descriptor *)&stack0xfffffffffffffc48;
  pVVar1 = (VaryingComponentsTest *)(ulong)stage;
  local_68 = varying_passthrough;
  GVar3 = (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase
                             .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))
                    ();
  local_60 = (_func_int **)((ulong)vector_type->m_basic_type | 0x100000000);
  local_58 = 1;
  last_in_location = TestBase::getLastInputLocation((TestBase *)this,stage,vector_type,GVar3);
  this_00 = (char *)pVVar1;
  si = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  local_70 = glcts::fixed_sample_locations_values + 1;
  if ((stage & ~VERTEX) == GEOMETRY) {
    local_70 = (bool *)0x1a4c56f;
  }
  iVar14 = 0;
  last_out_location = 0;
  if (stage != FRAGMENT) {
    this_00 = (char *)pVVar1;
    last_out_location = TestBase::getLastOutputLocation((TestBase *)this,stage,vector_type,GVar3);
  }
  if (SCALAR_SCALAR_SCALAR_SCALAR < test_case->m_layout) {
    bVar2 = false;
    goto LAB_008a0d7f;
  }
  local_398 = &local_150;
  local_390 = local_158;
  local_3a0 = &local_160;
  puVar16 = local_168;
  ppGVar6 = &local_170;
  pGVar13 = local_178;
  ppGVar5 = &local_180;
  pGVar7 = local_188;
  ppGVar12 = &local_190;
  switch(test_case->m_layout) {
  case GVEC4:
    ppcVar9 = &local_1a0;
    pGVar8 = local_1a8;
    local_398 = &local_1b0;
    local_390 = local_1b8;
    local_3a0 = &local_1c0;
    puVar16 = local_1c8;
    ppGVar6 = &local_1f8.m_name;
    pGVar13 = &local_1f8.m_n_rows;
    ppGVar5 = &local_1f8.m_location_str;
    pGVar7 = &local_1f8.m_location;
    uVar11 = 0;
    pcVar10 = "comp_x";
    GVar3 = 4;
    pcVar4 = "gvec4";
    ppGVar12 = &local_1f8.m_component_str;
    iVar14 = 2;
    break;
  case SCALAR_GVEC3:
    local_198 = 1;
    pcVar10 = "comp_y";
    GVar3 = 3;
    pcVar4 = "gvec3";
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    goto LAB_008a0825;
  case GVEC3_SCALAR:
    local_198 = 3;
    pcVar10 = "comp_w";
    GVar3 = 1;
    pcVar4 = "scalar";
    local_1f8.m_n_rows = 3;
    local_1f8.m_name = "gvec3";
    local_1a8[0] = 3;
    local_1a0 = "gvec3";
    goto LAB_008a0825;
  case GVEC2_GVEC2:
    GVar3 = 2;
    pcVar4 = "gvec2";
    pcVar10 = "comp_z";
    local_1f8.m_n_rows = 2;
    local_1f8.m_name = "gvec2";
    local_1a8[0] = 2;
    local_1a0 = "gvec2";
    local_198 = 2;
LAB_008a0825:
    local_1b0 = "last_output_location";
    local_1c0 = "comp_x";
    local_1c8[0] = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_location = 0;
    local_1f8.m_component_str = "comp_x";
    ppcVar9 = &local_140;
    iVar14 = 4;
    pGVar8 = local_148;
    uVar11 = local_198;
    local_1b8[0] = last_out_location;
    break;
  case GVEC2_SCALAR_SCALAR:
    local_1f8.m_n_rows = 2;
    local_1f8.m_name = "gvec2";
    local_1a8[0] = 2;
    local_1a0 = "gvec2";
    local_198 = 2;
    local_190 = "comp_z";
    local_178[0] = 1;
    local_170 = "scalar";
    local_168[0] = 2;
    local_160 = "comp_z";
    local_148[0] = 1;
    local_140 = "scalar";
    goto LAB_008a0a50;
  case SCALAR_GVEC2_SCALAR:
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    local_198 = 1;
    local_190 = "comp_y";
    local_178[0] = 2;
    local_170 = "gvec2";
    local_168[0] = 1;
    local_160 = "comp_y";
    local_148[0] = 2;
    local_140 = "gvec2";
LAB_008a0a50:
    local_150 = "last_output_location";
    local_180 = "first_output_location";
    local_188[0] = 0;
    local_1b0 = "last_output_location";
    local_1c0 = "comp_x";
    local_1c8[0] = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_location = 0;
    local_1f8.m_component_str = "comp_x";
    GVar3 = 1;
    pcVar10 = "comp_w";
    pcVar4 = "scalar";
    local_138 = 3;
    ppGVar12 = &local_130;
    pGVar7 = local_128;
    ppGVar5 = &local_120;
    ppGVar6 = &local_110;
    puVar16 = local_108;
    local_3a0 = &local_100;
    local_390 = local_f8;
    local_398 = &local_f0;
    pGVar8 = local_e8;
    ppcVar9 = &local_e0;
    iVar14 = 6;
    pGVar13 = local_118;
    uVar11 = 3;
    local_1b8[0] = last_out_location;
    local_158[0] = last_out_location;
    break;
  case SCALAR_SCALAR_GVEC2:
    GVar3 = 2;
    pcVar10 = "comp_z";
    pcVar4 = "gvec2";
    local_1f8.m_component_str = "comp_x";
    local_1f8.m_location = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1c8[0] = 0;
    local_1c0 = "comp_x";
    local_1b0 = "last_output_location";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    local_198 = 1;
    local_190 = "comp_y";
    local_188[0] = 0;
    local_180 = "first_output_location";
    local_178[0] = 1;
    local_170 = "scalar";
    local_168[0] = 1;
    local_160 = "comp_y";
    local_150 = "last_output_location";
    local_148[0] = 1;
    local_140 = "scalar";
    local_138 = 2;
    iVar14 = 6;
    ppGVar12 = &local_130;
    pGVar7 = local_128;
    ppGVar5 = &local_120;
    ppGVar6 = &local_110;
    puVar16 = local_108;
    local_3a0 = &local_100;
    local_390 = local_f8;
    local_398 = &local_f0;
    pGVar8 = local_e8;
    ppcVar9 = &local_e0;
    pGVar13 = local_118;
    uVar11 = 2;
    local_1b8[0] = last_out_location;
    local_158[0] = last_out_location;
    break;
  case SCALAR_SCALAR_SCALAR_SCALAR:
    ppcVar9 = local_80;
    local_398 = &local_90;
    local_390 = local_98;
    GVar3 = 1;
    pcVar4 = "scalar";
    pcVar10 = "comp_w";
    ppGVar12 = &local_d0;
    local_1f8.m_component_str = "comp_x";
    local_1f8.m_location = 0;
    local_1f8.m_location_str = "first_output_location";
    local_1f8.m_n_rows = 1;
    local_1f8.m_name = "scalar";
    local_1c8[0] = 0;
    local_1c0 = "comp_x";
    local_1b0 = "last_output_location";
    local_1a8[0] = 1;
    local_1a0 = "scalar";
    local_198 = 1;
    local_190 = "comp_y";
    local_188[0] = 0;
    local_180 = "first_output_location";
    local_178[0] = 1;
    local_170 = "scalar";
    local_168[0] = 1;
    local_160 = "comp_y";
    local_3a0 = &local_a0;
    local_150 = "last_output_location";
    local_148[0] = 1;
    local_140 = "scalar";
    local_138 = 2;
    local_130 = "comp_z";
    local_128[0] = 0;
    puVar16 = local_a8;
    local_120 = "first_output_location";
    pGVar8 = local_88;
    ppGVar6 = &local_b0;
    local_118[0] = 1;
    local_110 = "scalar";
    local_108[0] = 2;
    local_100 = "comp_z";
    ppGVar5 = &local_c0;
    local_f0 = "last_output_location";
    pGVar7 = local_c8;
    local_e8[0] = 1;
    local_e0 = "scalar";
    local_d8 = 3;
    iVar14 = 8;
    pGVar13 = local_b8;
    uVar11 = 3;
    local_1b8[0] = last_out_location;
    local_158[0] = last_out_location;
    local_f8[0] = last_out_location;
  }
  local_1f8.m_component = 0;
  *ppGVar12 = pcVar10;
  *pGVar7 = 0;
  this_00 = "first_output_location";
  *ppGVar5 = "first_output_location";
  *pGVar13 = GVar3;
  *ppGVar6 = pcVar4;
  *puVar16 = uVar11;
  *local_3a0 = pcVar10;
  *local_390 = last_out_location;
  *local_398 = "last_output_location";
  *pGVar8 = GVar3;
  *ppcVar9 = pcVar4;
  bVar2 = true;
LAB_008a0d7f:
  if (bVar2) {
    uVar15 = (ulong)(iVar14 + (uint)(iVar14 == 0));
    desc = &local_1f8;
    do {
      desc_00 = desc_00 + 1;
      this_00 = (char *)&stack0xffffffffffffffa0;
      in = prepareVarying(this,(Type *)&stack0xffffffffffffffa0,desc_00,local_70,si,stage,
                          VARYING_INPUT);
      if (stage != FRAGMENT) {
        out = prepareVarying(this,(Type *)&stack0xffffffffffffffa0,desc,local_70,si,stage,
                             VARYING_OUTPUT);
        this_00 = (char *)pVVar1;
        Utils::VaryingPassthrough::Add(local_68,stage,in,out);
      }
      desc = desc + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  prepareGlobals_abi_cxx11_
            ((string *)&stack0xffffffffffffffb0,(VaryingComponentsTest *)this_00,last_in_location,
             last_out_location);
  std::__cxx11::string::operator=((string *)si,(string *)&stack0xffffffffffffffb0);
  if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p,local_40 + 1);
  }
  return;
}

Assistant:

void VaryingComponentsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& vector_type,
											   Utils::ProgramInterface& program_interface, const testCase& test_case,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint			array_length = getArrayLength();
	const Utils::Type&		basic_type = Utils::Type::GetType(vector_type.m_basic_type, 1 /* n_cols */, 1 /* n_rows */);
	descriptor				desc_in[8];
	descriptor				desc_out[8];
	const GLuint			first_in_loc  = 0;
	const GLuint			first_out_loc = 0;
	const GLchar*			interpolation = "";
	const GLuint			last_in_loc   = getLastInputLocation(stage, vector_type, array_length);
	GLuint					last_out_loc  = 0;
	GLuint					n_desc		  = 0;
	Utils::ShaderInterface& si			  = program_interface.GetShaderInterface(stage);

	/* Select interpolation */
	if ((Utils::Shader::FRAGMENT == stage) || (Utils::Shader::GEOMETRY == stage))
	{
		interpolation = " flat";
	}

	if (Utils::Shader::FRAGMENT != stage)
	{
		last_out_loc = getLastOutputLocation(stage, vector_type, array_length);
	}

	switch (test_case.m_layout)
	{
	case GVEC4:
		n_desc = 2;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 4, "gvec4");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 4, "gvec4");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 4, "gvec4");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 4, "gvec4");
		break;
	case SCALAR_GVEC3:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 3, "gvec3");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 3, "gvec3");
		break;
	case GVEC3_SCALAR:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 3, "gvec3");
		desc_in[2].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 3, "gvec3");
		desc_out[2].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case GVEC2_GVEC2:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case GVEC2_SCALAR_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_GVEC2_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_SCALAR_GVEC2:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case SCALAR_SCALAR_SCALAR_SCALAR:
		n_desc = 8;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[6].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[7].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[6].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[7].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	}

	for (GLuint i = 0; i < n_desc; ++i)
	{
		const descriptor& in_desc = desc_in[i];

		Utils::Variable* in =
			prepareVarying(basic_type, in_desc, interpolation, si, stage, Utils::Variable::VARYING_INPUT);

		if (Utils::Shader::FRAGMENT != stage)
		{
			const descriptor& out_desc = desc_out[i];

			Utils::Variable* out =
				prepareVarying(basic_type, out_desc, interpolation, si, stage, Utils::Variable::VARYING_OUTPUT);

			varying_passthrough.Add(stage, in, out);
		}
	}

	si.m_globals = prepareGlobals(last_in_loc, last_out_loc);
}